

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O2

void M_SaveJoystickConfig(IJoystickConfig *joy)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  char key [32];
  char value [32];
  
  bVar1 = M_SetJoystickConfigSection(joy,true);
  if (bVar1) {
    FConfigFile::ClearCurrentSection(&GameConfig->super_FConfigFile);
    iVar2 = (*joy->_vptr_IJoystickConfig[0xd])(joy);
    if ((char)iVar2 == '\0') {
      (*joy->_vptr_IJoystickConfig[3])(joy);
      mysnprintf(value,0x20,"%g",(double)extraout_XMM0_Da);
      FConfigFile::SetValueForKey(&GameConfig->super_FConfigFile,"Sensitivity",value,false);
    }
    uVar3 = (*joy->_vptr_IJoystickConfig[5])(joy);
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = mysnprintf(key,0x20,"Axis%u");
      iVar4 = (*joy->_vptr_IJoystickConfig[0xe])(joy,(ulong)uVar6);
      lVar5 = (long)iVar2;
      if ((char)iVar4 == '\0') {
        mysnprintf(key + lVar5,0x20 - lVar5,"deadzone");
        (*joy->_vptr_IJoystickConfig[6])(joy,(ulong)uVar6);
        mysnprintf(value,0x20,"%g",(double)extraout_XMM0_Da_00);
        FConfigFile::SetValueForKey(&GameConfig->super_FConfigFile,key,value,false);
      }
      iVar2 = (*joy->_vptr_IJoystickConfig[0x10])(joy,(ulong)uVar6);
      if ((char)iVar2 == '\0') {
        mysnprintf(key + lVar5,0x20 - lVar5,"scale");
        (*joy->_vptr_IJoystickConfig[9])(joy,(ulong)uVar6);
        mysnprintf(value,0x20,"%g",(double)extraout_XMM0_Da_01);
        FConfigFile::SetValueForKey(&GameConfig->super_FConfigFile,key,value,false);
      }
      iVar2 = (*joy->_vptr_IJoystickConfig[0xf])(joy,(ulong)uVar6);
      if ((char)iVar2 == '\0') {
        mysnprintf(key + lVar5,0x20 - lVar5,"map");
        (*joy->_vptr_IJoystickConfig[7])(joy,(ulong)uVar6);
        mysnprintf(value,0x20,"%d");
        FConfigFile::SetValueForKey(&GameConfig->super_FConfigFile,key,value,false);
      }
    }
    bVar1 = FConfigFile::SectionIsEmpty(&GameConfig->super_FConfigFile);
    if (bVar1) {
      FConfigFile::DeleteCurrentSection(&GameConfig->super_FConfigFile);
    }
  }
  return;
}

Assistant:

void M_SaveJoystickConfig(IJoystickConfig *joy)
{
	char key[32], value[32];
	int axislen, numaxes;

	if (M_SetJoystickConfigSection(joy, true))
	{
		GameConfig->ClearCurrentSection();
		if (!joy->IsSensitivityDefault())
		{
			mysnprintf(value, countof(value), "%g", joy->GetSensitivity());
			GameConfig->SetValueForKey("Sensitivity", value);
		}
		numaxes = joy->GetNumAxes();
		for (int i = 0; i < numaxes; ++i)
		{
			axislen = mysnprintf(key, countof(key), "Axis%u", i);

			if (!joy->IsAxisDeadZoneDefault(i))
			{
				mysnprintf(key + axislen, countof(key) - axislen, "deadzone");
				mysnprintf(value, countof(value), "%g", joy->GetAxisDeadZone(i));
				GameConfig->SetValueForKey(key, value);
			}
			if (!joy->IsAxisScaleDefault(i))
			{
				mysnprintf(key + axislen, countof(key) - axislen, "scale");
				mysnprintf(value, countof(value), "%g", joy->GetAxisScale(i));
				GameConfig->SetValueForKey(key, value);
			}
			if (!joy->IsAxisMapDefault(i))
			{
				mysnprintf(key + axislen, countof(key) - axislen, "map");
				mysnprintf(value, countof(value), "%d", joy->GetAxisMap(i));
				GameConfig->SetValueForKey(key, value);
			}
		}
		// If the joystick is entirely at its defaults, delete this section
		// so that we don't write out a lone section header.
		if (GameConfig->SectionIsEmpty())
		{
			GameConfig->DeleteCurrentSection();
		}
	}
}